

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPClient.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  ssize_t sVar4;
  ssize_t n_2;
  ssize_t n_1;
  ssize_t n;
  char *p;
  char buff [4096];
  sockaddr_in servaddr;
  int sockfd;
  int in_stack_ffffffffffffef70;
  undefined1 local_1028 [4100];
  sockaddr local_24;
  int local_14;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = socket(2,1,0);
  bzero(&local_24,0x10);
  local_24.sa_family = 2;
  local_24.sa_data._0_2_ = htons(0x1f98);
  inet_pton(2,"127.0.0.1",local_24.sa_data + 2);
  local_1028[0] = 0;
  iVar1 = connect(local_14,&local_24,0x10);
  if (iVar1 == 0) {
    setSocketNonBlocking1(in_stack_ffffffffffffef70);
    poVar2 = std::operator<<((ostream *)&std::cout,"=========1:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    iVar1 = local_14;
    sVar3 = strlen(" ");
    write(iVar1," ",sVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,"strlen(p) = ");
    sVar3 = strlen(" ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    sleep(1);
    sVar4 = read(local_14,local_1028,0x1000);
    poVar2 = std::operator<<((ostream *)&std::cout,"n=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    printf("%s",local_1028);
    close(local_14);
  }
  else {
    perror("err1");
  }
  sleep(1);
  local_14 = socket(2,1,0);
  iVar1 = connect(local_14,&local_24,0x10);
  if (iVar1 == 0) {
    setSocketNonBlocking1(in_stack_ffffffffffffef70);
    poVar2 = std::operator<<((ostream *)&std::cout,"=========2:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    iVar1 = local_14;
    sVar3 = strlen("GET  HTTP/1.1");
    write(iVar1,"GET  HTTP/1.1",sVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,"strlen(p) = ");
    sVar3 = strlen("GET  HTTP/1.1");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    sleep(1);
    sVar4 = read(local_14,local_1028,0x1000);
    poVar2 = std::operator<<((ostream *)&std::cout,"n=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    printf("%s",local_1028);
    close(local_14);
  }
  else {
    perror("err2");
  }
  sleep(1);
  local_14 = socket(2,1,0);
  iVar1 = connect(local_14,&local_24,0x10);
  if (iVar1 == 0) {
    setSocketNonBlocking1(in_stack_ffffffffffffef70);
    poVar2 = std::operator<<((ostream *)&std::cout,"========3:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    iVar1 = local_14;
    sVar3 = strlen(
                  "GET / HTTP/1.1\r\nHost: 192.168.52.135:8088\r\nContent-Type: application/x-www-form-urlencoded\r\nConnection: Keep-Alive\r\n\r\n"
                  );
    write(iVar1,
          "GET / HTTP/1.1\r\nHost: 192.168.52.135:8088\r\nContent-Type: application/x-www-form-urlencoded\r\nConnection: Keep-Alive\r\n\r\n"
          ,sVar3);
    poVar2 = std::operator<<((ostream *)&std::cout,"strlen(p) = ");
    sVar3 = strlen(
                  "GET / HTTP/1.1\r\nHost: 192.168.52.135:8088\r\nContent-Type: application/x-www-form-urlencoded\r\nConnection: Keep-Alive\r\n\r\n"
                  );
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    sleep(1);
    sVar4 = read(local_14,local_1028,0x1000);
    poVar2 = std::operator<<((ostream *)&std::cout,"n=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    printf("%s",local_1028);
    close(local_14);
  }
  else {
    perror("err3");
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  int sockfd;
  struct sockaddr_in servaddr;

  sockfd = socket(AF_INET, SOCK_STREAM, 0);

  bzero(&servaddr, sizeof(servaddr));
  servaddr.sin_family = AF_INET;
  servaddr.sin_port = htons(SERV_PORT);
  inet_pton(AF_INET, IPADDRESS, &servaddr.sin_addr);
  // inet_pton(AF_INET, const char *__restrict __cp, void *__restrict __buf);

  char buff[4096];
  buff[0] = '\0';

  // 发空串
  const char *p = " ";
  if (connect(sockfd, (struct sockaddr *)&servaddr, sizeof(servaddr)) == 0) {
    setSocketNonBlocking1(sockfd);
    cout << "=========1:" << endl;
    ssize_t n = write(sockfd, p, strlen(p));
    cout << "strlen(p) = " << strlen(p) << endl;
    sleep(1);
    n = read(sockfd, buff, 4096);
    cout << "n=" << n << endl;
    printf("%s", buff);
    close(sockfd);
  } else {
    perror("err1");
  }
  sleep(1);


  // 发"GET  HTTP/1.1"
  p = "GET  HTTP/1.1";
  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (connect(sockfd, (struct sockaddr *)&servaddr, sizeof(servaddr)) == 0) {
    setSocketNonBlocking1(sockfd);
    cout << "=========2:" << endl;
    ssize_t n = write(sockfd, p, strlen(p));
    cout << "strlen(p) = " << strlen(p) << endl;
    sleep(1);
    n = read(sockfd, buff, 4096);
    cout << "n=" << n << endl;
    printf("%s", buff);
    close(sockfd);
  } else {
    perror("err2");
  }
  sleep(1);

  // 发
  // GET  HTTP/1.1
  // Host: 192.168.52.135:8088
  // Content-Type: application/x-www-form-urlencoded
  // Connection: Keep-Alive
  p = "GET / HTTP/1.1\r\nHost: 192.168.52.135:8088\r\nContent-Type: "
      "application/x-www-form-urlencoded\r\nConnection: Keep-Alive\r\n\r\n";
  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (connect(sockfd, (struct sockaddr *)&servaddr, sizeof(servaddr)) == 0) {
    setSocketNonBlocking1(sockfd);
    cout << "========3:" << endl;
    ssize_t n = write(sockfd, p, strlen(p));
    cout << "strlen(p) = " << strlen(p) << endl;
    sleep(1);
    n = read(sockfd, buff, 4096);
    cout << "n=" << n << endl;
    printf("%s", buff);
    close(sockfd);
  } else {
    perror("err3");
  }
  
  return 0;
}